

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

FinalizableICUObject<UPluralRules_*,_&uplrules_close_70> *
Js::FinalizableICUObject<UPluralRules_*,_&uplrules_close_70>::New
          (Recycler *recycler,UPluralRules *resource)

{
  Recycler *alloc;
  FinalizableICUObject<UPluralRules_*,_&uplrules_close_70> *this;
  TrackAllocData local_40;
  UPluralRules *local_18;
  UPluralRules *resource_local;
  Recycler *recycler_local;
  
  local_18 = resource;
  resource_local = (UPluralRules *)recycler;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,
             (type_info *)&FinalizableICUObject<UPluralRules*,&uplrules_close_70>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
             ,0x130);
  alloc = Memory::Recycler::TrackAllocInfo(recycler,&local_40);
  this = (FinalizableICUObject<UPluralRules_*,_&uplrules_close_70> *)
         new<Memory::Recycler>(0x10,alloc,0x4642b0);
  FinalizableICUObject(this,local_18);
  return this;
}

Assistant:

static FinalizableICUObject<TResource, CloseFunction> *New(Recycler *recycler, TResource resource)
        {
            return RecyclerNewFinalized(recycler, FinalizableICUObject, resource);
        }